

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O2

bool __thiscall deqp::gles31::Functional::ProgramInterfaceDefinition::Shader::isValid(Shader *this)

{
  uint uVar1;
  pointer pIVar2;
  pointer piVar3;
  pointer piVar4;
  long lVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int varNdx;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  pointer pVVar15;
  VarType *pVVar16;
  Layout layoutWithLocationAndBinding;
  
  lVar13 = 0x20;
  for (lVar12 = 0;
      pVVar15 = (this->m_defaultBlock).variables.
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_start,
      lVar12 < (int)(((long)(this->m_defaultBlock).variables.
                            super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar15) / 0x60);
      lVar12 = lVar12 + 1) {
    if (*(int *)((long)pVVar15 + lVar13 + -0x1c) == -1) {
      bVar6 = ProgramInterfaceDefinition::anon_unknown_0::containsMatchingSubtype
                        ((VarType *)((long)&(pVVar15->layout).location + lVar13),
                         glu::isDataTypeAtomicCounter);
      if (bVar6) {
        return false;
      }
      pVVar15 = (this->m_defaultBlock).variables.
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    if (*(int *)((long)&(pVVar15->layout).location + lVar13) == 2) {
      bVar6 = ProgramInterfaceDefinition::anon_unknown_0::containsMatchingSubtype
                        ((VarType *)((long)&(pVVar15->layout).location + lVar13),
                         glu::isDataTypeAtomicCounter);
      if (bVar6) {
        return false;
      }
      pVVar15 = (this->m_defaultBlock).variables.
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    if (*(int *)((long)pVVar15 + lVar13 + -0x10) != 2) {
      return false;
    }
    bVar6 = ProgramInterfaceDefinition::anon_unknown_0::containsMatchingSubtype
                      ((VarType *)((long)&(pVVar15->layout).location + lVar13),
                       glu::isDataTypeSampler);
    if (bVar6) {
      pVVar15 = (this->m_defaultBlock).variables.
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_start;
      glu::Layout::Layout(&layoutWithLocationAndBinding,*(int *)((long)pVVar15 + lVar13 + -0x20),
                          *(int *)((long)pVVar15 + lVar13 + -0x1c),-1,FORMATLAYOUT_LAST,
                          MATRIXORDER_LAST);
      bVar6 = glu::Layout::operator!=
                        ((Layout *)
                         ((long)(this->m_defaultBlock).variables.
                                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x20),
                         &layoutWithLocationAndBinding);
      if (bVar6) {
        return false;
      }
    }
    lVar13 = lVar13 + 0x60;
  }
  iVar14 = 0;
  while( true ) {
    lVar13 = 0x20;
    pIVar2 = (this->m_defaultBlock).interfaceBlocks.
             super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = ((long)(this->m_defaultBlock).interfaceBlocks.
                   super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) / 0x90;
    iVar11 = (int)uVar7;
    if (iVar11 <= iVar14) break;
    piVar3 = pIVar2[iVar14].dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = *(pointer *)
              ((long)&pIVar2[iVar14].dimensions.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl + 8);
    if (4 < (ulong)((long)piVar4 - (long)piVar3)) {
      return false;
    }
    if ((piVar3 != piVar4) && (pIVar2[iVar14].instanceName._M_string_length == 0)) {
      return false;
    }
    lVar12 = -1;
    while( true ) {
      lVar5 = *(long *)&pIVar2[iVar14].variables.
                        super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                        ._M_impl.super__Vector_impl_data;
      lVar12 = lVar12 + 1;
      if ((int)(((long)*(pointer *)
                        ((long)&pIVar2[iVar14].variables.
                                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                ._M_impl + 8) - lVar5) / 0x60) <= lVar12) break;
      pVVar16 = (VarType *)(lVar5 + lVar13);
      lVar13 = lVar13 + 0x60;
      bVar6 = ProgramInterfaceDefinition::anon_unknown_0::containsMatchingSubtype
                        (pVVar16,ProgramInterfaceDefinition::anon_unknown_0::isOpaqueType);
      if (bVar6) {
        return false;
      }
    }
    iVar14 = iVar14 + 1;
  }
  switch(this->m_shaderType) {
  case SHADERTYPE_VERTEX:
    pVVar15 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = ((long)(this->m_defaultBlock).variables.
                   super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar15) / 0x60;
    uVar10 = 0;
    uVar9 = uVar8 & 0xffffffff;
    if ((int)uVar8 < 1) {
      uVar9 = uVar10;
    }
    for (; uVar9 * 0x60 != uVar10; uVar10 = uVar10 + 0x60) {
      iVar14 = *(int *)((long)&pVVar15->storage + uVar10);
      if (iVar14 == 1) {
        pVVar16 = (VarType *)((long)&pVVar15->varType + uVar10);
        bVar6 = isIllegalVertexOutput(pVVar16,false,false);
        if (bVar6) {
          return false;
        }
        if ((*(int *)((long)&pVVar15->interpolation + uVar10) != 1) &&
           (bVar6 = isTypeIntegerOrContainsIntegers
                              ((ProgramInterfaceDefinition *)pVVar16,(VarType *)pVVar15), bVar6)) {
          return false;
        }
      }
      else if (iVar14 == 0) {
        if (*(int *)((long)&pVVar15->varType + uVar10) != 0) {
          return false;
        }
        if (*(int *)((long)&pVVar15->varType + uVar10 + 8) - 0x23U < 4) {
          return false;
        }
      }
    }
    uVar9 = 0;
    uVar7 = uVar7 & 0xffffffff;
    if (iVar11 < 1) {
      uVar7 = uVar9;
    }
    while ((bVar6 = uVar7 * 0x90 - uVar9 == 0, !bVar6 &&
           ((uVar1 = *(uint *)((long)&pIVar2->storage + uVar9), 6 < uVar1 ||
            ((0x61U >> (uVar1 & 0x1f) & 1) == 0))))) {
      uVar9 = uVar9 + 0x90;
    }
    break;
  case SHADERTYPE_FRAGMENT:
    pVVar15 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = ((long)(this->m_defaultBlock).variables.
                   super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar15) / 0x60;
    uVar10 = 0;
    uVar9 = uVar8 & 0xffffffff;
    if ((int)uVar8 < 1) {
      uVar9 = uVar10;
    }
    for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      if (pVVar15[uVar10].storage == STORAGE_OUT) {
        bVar6 = false;
        for (pVVar16 = &pVVar15[uVar10].varType; pVVar16->m_type == TYPE_ARRAY;
            pVVar16 = (pVVar16->m_data).array.elementType) {
          if (bVar6) {
            return false;
          }
          bVar6 = true;
        }
        if (pVVar16->m_type != TYPE_BASIC) {
          return false;
        }
        iVar14 = (pVVar16->m_data).basic.type;
        if ((iVar14 - 1U < 0x23) && ((0x7fc01e00fU >> ((ulong)(iVar14 - 1U) & 0x3f) & 1) != 0)) {
          bVar6 = false;
        }
        else {
          if (iVar14 - 0x24U < 3) {
            return false;
          }
          bVar6 = iVar14 - 0x1bU < 0xfffffff7 && iVar14 - 0xeU < 0xfffffff7;
        }
        if (iVar14 - 0x23U < 4) {
          return false;
        }
        if (bVar6) {
          return false;
        }
        if (iVar14 - 5U < 9) {
          return false;
        }
        if (iVar14 - 0x12U < 9) {
          return false;
        }
      }
      else if (pVVar15[uVar10].storage == STORAGE_IN) {
        bVar6 = isIllegalVertexOutput(&pVVar15[uVar10].varType,false,false);
        if (bVar6) {
          return false;
        }
        if ((*(int *)&((Data *)&pVVar15[uVar10].interpolation)->basic != 1) &&
           (bVar6 = isTypeIntegerOrContainsIntegers
                              ((ProgramInterfaceDefinition *)&pVVar15[uVar10].varType,
                               (VarType *)pVVar15), bVar6)) {
          return false;
        }
      }
    }
    uVar9 = 0;
    uVar7 = uVar7 & 0xffffffff;
    if (iVar11 < 1) {
      uVar7 = uVar9;
    }
    while ((bVar6 = uVar7 * 0x90 - uVar9 == 0, !bVar6 &&
           ((uVar1 = *(uint *)((long)&pIVar2->storage + uVar9), 6 < uVar1 ||
            ((0x62U >> (uVar1 & 0x1f) & 1) == 0))))) {
      uVar9 = uVar9 + 0x90;
    }
    break;
  case SHADERTYPE_GEOMETRY:
    pVVar15 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = ((long)(this->m_defaultBlock).variables.
                   super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar15) / 0x60;
    uVar10 = 0;
    uVar9 = uVar8 & 0xffffffff;
    if ((int)uVar8 < 1) {
      uVar9 = uVar10;
    }
    for (; uVar9 * 0x60 - uVar10 != 0; uVar10 = uVar10 + 0x60) {
      iVar14 = *(int *)((long)&pVVar15->storage + uVar10);
      if (iVar14 == 0) {
        if (*(int *)((long)&(pVVar15->varType).m_type + uVar10) != 1) {
          return false;
        }
      }
      else if (iVar14 - 5U < 2) {
        return false;
      }
    }
    uVar9 = 0;
    uVar7 = uVar7 & 0xffffffff;
    if (iVar11 < 1) {
      uVar7 = uVar9;
    }
    for (; bVar6 = uVar7 * 0x90 - uVar9 == 0, !bVar6; uVar9 = uVar9 + 0x90) {
      iVar14 = *(int *)((long)&pIVar2->storage + uVar9);
      if (iVar14 == 0) {
        if (*(long *)((long)&(pIVar2->dimensions).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl + uVar9) ==
            *(long *)((long)&(pIVar2->dimensions).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl + uVar9 + 8)) {
          return bVar6;
        }
      }
      else if (iVar14 - 5U < 2) {
        return bVar6;
      }
    }
    break;
  case SHADERTYPE_TESSELLATION_CONTROL:
    pVVar15 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = ((long)(this->m_defaultBlock).variables.
                   super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar15) / 0x60;
    uVar10 = 0;
    uVar9 = uVar8 & 0xffffffff;
    if ((int)uVar8 < 1) {
      uVar9 = uVar10;
    }
    for (; uVar9 * 0x60 - uVar10 != 0; uVar10 = uVar10 + 0x60) {
      iVar14 = *(int *)((long)&pVVar15->storage + uVar10);
      if ((iVar14 == 0) || (iVar14 == 1)) {
        if (*(int *)((long)&(pVVar15->varType).m_type + uVar10) != 1) {
          return false;
        }
      }
      else if (iVar14 == 5) {
        return false;
      }
    }
    uVar9 = 0;
    uVar7 = uVar7 & 0xffffffff;
    if (iVar11 < 1) {
      uVar7 = uVar9;
    }
    for (; bVar6 = uVar7 * 0x90 - uVar9 == 0, !bVar6; uVar9 = uVar9 + 0x90) {
      iVar14 = *(int *)((long)&pIVar2->storage + uVar9);
      if ((iVar14 == 0) || (iVar14 == 1)) {
        if (*(long *)((long)&(pIVar2->dimensions).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl + uVar9) ==
            *(long *)((long)&(pIVar2->dimensions).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl + uVar9 + 8)) {
          return bVar6;
        }
      }
      else if (iVar14 == 5) {
        return bVar6;
      }
    }
    break;
  case SHADERTYPE_TESSELLATION_EVALUATION:
    pVVar15 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = ((long)(this->m_defaultBlock).variables.
                   super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar15) / 0x60;
    uVar10 = 0;
    uVar9 = uVar8 & 0xffffffff;
    if ((int)uVar8 < 1) {
      uVar9 = uVar10;
    }
    for (; uVar9 * 0x60 - uVar10 != 0; uVar10 = uVar10 + 0x60) {
      iVar14 = *(int *)((long)&pVVar15->storage + uVar10);
      if (iVar14 == 0) {
        if (*(int *)((long)&(pVVar15->varType).m_type + uVar10) != 1) {
          return false;
        }
      }
      else if (iVar14 == 6) {
        return false;
      }
    }
    uVar9 = 0;
    uVar7 = uVar7 & 0xffffffff;
    if (iVar11 < 1) {
      uVar7 = uVar9;
    }
    for (; bVar6 = uVar7 * 0x90 - uVar9 == 0, !bVar6; uVar9 = uVar9 + 0x90) {
      iVar14 = *(int *)((long)&pIVar2->storage + uVar9);
      if (iVar14 == 0) {
        if (*(long *)((long)&(pIVar2->dimensions).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl + uVar9) ==
            *(long *)((long)&(pIVar2->dimensions).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl + uVar9 + 8)) {
          return bVar6;
        }
      }
      else if (iVar14 == 6) {
        return bVar6;
      }
    }
    break;
  case SHADERTYPE_COMPUTE:
    pVVar15 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = ((long)(this->m_defaultBlock).variables.
                   super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar15) / 0x60;
    uVar10 = 0;
    uVar9 = uVar8 & 0xffffffff;
    if ((int)uVar8 < 1) {
      uVar9 = uVar10;
    }
    for (; uVar9 * 0x60 - uVar10 != 0; uVar10 = uVar10 + 0x60) {
      uVar1 = *(uint *)((long)&pVVar15->storage + uVar10);
      if ((uVar1 < 7) && ((99U >> (uVar1 & 0x1f) & 1) != 0)) {
        return false;
      }
    }
    uVar9 = 0;
    uVar7 = uVar7 & 0xffffffff;
    if (iVar11 < 1) {
      uVar7 = uVar9;
    }
    while ((bVar6 = uVar7 * 0x90 - uVar9 == 0, !bVar6 &&
           ((uVar1 = *(uint *)((long)&pIVar2->storage + uVar9), 6 < uVar1 ||
            ((99U >> (uVar1 & 0x1f) & 1) == 0))))) {
      uVar9 = uVar9 + 0x90;
    }
    break;
  default:
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool Shader::isValid (void) const
{
	// Default block variables
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			// atomic declaration in the default block without binding
			if (m_defaultBlock.variables[varNdx].layout.binding == -1 &&
				containsMatchingSubtype(m_defaultBlock.variables[varNdx].varType, glu::isDataTypeAtomicCounter))
				return false;

			// atomic declaration in a struct
			if (m_defaultBlock.variables[varNdx].varType.isStructType() &&
				containsMatchingSubtype(m_defaultBlock.variables[varNdx].varType, glu::isDataTypeAtomicCounter))
				return false;

			// Unsupported layout qualifiers

			if (m_defaultBlock.variables[varNdx].layout.matrixOrder != glu::MATRIXORDER_LAST)
				return false;

			if (containsMatchingSubtype(m_defaultBlock.variables[varNdx].varType, glu::isDataTypeSampler))
			{
				const glu::Layout layoutWithLocationAndBinding(m_defaultBlock.variables[varNdx].layout.location, m_defaultBlock.variables[varNdx].layout.binding);

				if (m_defaultBlock.variables[varNdx].layout != layoutWithLocationAndBinding)
					return false;
			}
		}
	}

	// Interface blocks
	{
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			// ES31 disallows interface block array arrays
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.size() > 1)
				return false;

			// Interface block arrays must have instance name
			if (!m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty() && m_defaultBlock.interfaceBlocks[interfaceNdx].instanceName.empty())
				return false;

			// Opaque types in interface block
			if (containsMatchingSubtype(m_defaultBlock.interfaceBlocks[interfaceNdx].variables, isOpaqueType))
				return false;
		}
	}

	// Shader type specific

	if (m_shaderType == glu::SHADERTYPE_VERTEX)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && isIllegalVertexInput(m_defaultBlock.variables[varNdx].varType))
				return false;
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT && isIllegalVertexOutput(m_defaultBlock.variables[varNdx].varType))
				return false;
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT && m_defaultBlock.variables[varNdx].interpolation != glu::INTERPOLATION_FLAT && isTypeIntegerOrContainsIntegers(m_defaultBlock.variables[varNdx].varType))
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN			||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_FRAGMENT)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && isIllegalFragmentInput(m_defaultBlock.variables[varNdx].varType))
				return false;
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && m_defaultBlock.variables[varNdx].interpolation != glu::INTERPOLATION_FLAT && isTypeIntegerOrContainsIntegers(m_defaultBlock.variables[varNdx].varType))
				return false;
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT && isIllegalFragmentOutput(m_defaultBlock.variables[varNdx].varType))
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_OUT		||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_COMPUTE)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN			||
				m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT		||
				m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN			||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_OUT		||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_GEOMETRY)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
			// arrayed input
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && !m_defaultBlock.variables[varNdx].varType.isArrayType())
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
			// arrayed input
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN && m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty())
				return false;
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_IN)
				return false;
			// arrayed input
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && !m_defaultBlock.variables[varNdx].varType.isArrayType())
				return false;
			// arrayed output
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT && !m_defaultBlock.variables[varNdx].varType.isArrayType())
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN)
				return false;
			// arrayed input
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN && m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty())
				return false;
			// arrayed output
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_OUT && m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty())
				return false;
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_TESSELLATION_EVALUATION)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_OUT)
				return false;
			// arrayed input
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && !m_defaultBlock.variables[varNdx].varType.isArrayType())
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
				return false;
			// arrayed input
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN && m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty())
				return false;
		}
	}
	else
		DE_ASSERT(false);

	return true;
}